

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O0

void __thiscall CConnman::NodesSnapshot::~NodesSnapshot(NodesSnapshot *this)

{
  long lVar1;
  bool bVar2;
  CNode *in_RDI;
  long in_FS_OFFSET;
  CNode **node;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range2;
  iterator __end2;
  iterator __begin2;
  vector<CNode_*,_std::allocator<CNode_*>_> *in_stack_ffffffffffffffd0;
  CNode *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::vector<CNode_*,_std::allocator<CNode_*>_>::begin(in_stack_ffffffffffffffd0);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::end(in_stack_ffffffffffffffd0);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                      ((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                        *)this_00,
                       (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                        *)in_stack_ffffffffffffffd0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffd0 =
         (vector<CNode_*,_std::allocator<CNode_*>_> *)
         __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
         operator*((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
                   in_RDI);
    CNode::Release(in_RDI);
    __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator++((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
               in_RDI);
  }
  std::vector<CNode_*,_std::allocator<CNode_*>_>::~vector
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~NodesSnapshot()
        {
            for (auto& node : m_nodes_copy) {
                node->Release();
            }
        }